

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ostream * Catch::clara::TextFlow::operator<<(ostream *os,Columns *cols)

{
  bool bVar1;
  ostream *in_RDI;
  string line;
  iterator __end3;
  iterator __begin3;
  Columns *__range3;
  bool first;
  iterator *in_stack_000000b8;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  iterator *in_stack_ffffffffffffff60;
  Columns *in_stack_ffffffffffffff68;
  iterator *in_stack_ffffffffffffffa0;
  
  bVar1 = true;
  Columns::begin((Columns *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  Columns::end(in_stack_ffffffffffffff68);
  while( true ) {
    in_stack_ffffffffffffff5f =
         Columns::iterator::operator!=
                   (in_stack_ffffffffffffff60,
                    (iterator *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    if (!(bool)in_stack_ffffffffffffff5f) break;
    Columns::iterator::operator*[abi_cxx11_(in_stack_000000b8);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      ::std::operator<<(in_RDI,"\n");
    }
    ::std::operator<<(in_RDI,(string *)&stack0xffffffffffffff60);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
    Columns::iterator::operator++(in_stack_ffffffffffffffa0);
  }
  Columns::iterator::~iterator((iterator *)0x161d80);
  Columns::iterator::~iterator((iterator *)0x161d8a);
  return in_RDI;
}

Assistant:

inline friend std::ostream& operator << (std::ostream& os, Columns const& cols) {

		bool first = true;
		for (auto line : cols) {
			if (first)
				first = false;
			else
				os << "\n";
			os << line;
		}
		return os;
	}